

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O1

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::FragmentTextureWorkloadCullCase::genOccludedGeometry
          (ObjectData *__return_storage_ptr__,FragmentTextureWorkloadCullCase *this)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  size_type __dnew;
  size_type __dnew_1;
  value_type local_140;
  value_type local_120;
  size_type local_100;
  ProgramSources local_f8;
  
  local_120._M_dataplus._M_p = (pointer)0xc1;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  pcVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_140,(ulong)&local_120);
  _Var1._M_p = local_120._M_dataplus._M_p;
  local_140.field_2._M_allocated_capacity = (size_type)local_120._M_dataplus._M_p;
  local_140._M_dataplus._M_p = pcVar3;
  memcpy(pcVar3,
         "#version 300 es\nin highp vec4 a_position;\nout mediump vec3 v_bcoords;\nvoid main()\n{\n\tv_bcoords = vec3(0, 0, 0);\n\tv_bcoords[int(a_position.w)] = 1.0;\n\tgl_Position = vec4(a_position.xyz, 1.0);\n}\n"
         ,0xc1);
  local_140._M_string_length = (size_type)_Var1._M_p;
  pcVar3[_Var1._M_p] = '\0';
  local_100 = 0x1a2;
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  pcVar3 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_120,(ulong)&local_100);
  sVar2 = local_100;
  local_120.field_2._M_allocated_capacity = local_100;
  local_120._M_dataplus._M_p = pcVar3;
  memcpy(pcVar3,
         "#version 300 es\nin mediump vec3 v_bcoords;\nout mediump vec4 fragColor;\nuniform mediump int u_iterations;\nuniform sampler2D u_texture;\nvoid main()\n{\n\tmediump float d = gl_FragCoord.z;\n\tfor (int i = 0; i<u_iterations; i++)\n\t\td *= texture(u_texture, (gl_FragCoord.xy+vec2(i))/512.0).r;\n\tif (v_bcoords.x < 0.02 || v_bcoords.y < 0.02 || v_bcoords.z < 0.02)\n\t\tfragColor = vec4(1,1,1,1);\n\telse\n\t\tfragColor = vec4(d,0,0,1);\n}\n"
         ,0x1a2);
  local_120._M_string_length = sVar2;
  pcVar3[sVar2] = '\0';
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  memset(&local_f8,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_f8.sources,&local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_f8.sources + 1,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,(ulong)(local_140.field_2._M_allocated_capacity + 1))
    ;
  }
  Utils::getFullscreenQuad((vector<float,_std::allocator<float>_> *)&local_140,0.8);
  ObjectData::ObjectData(__return_storage_ptr__,&local_f8,(Geometry *)&local_140);
  if (local_140._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_140._M_dataplus._M_p,
                    local_140.field_2._M_allocated_capacity - (long)local_140._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_f8.attribLocationBindings);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_f8.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccludedGeometry					(void) const
	{
		return ObjectData(Utils::getTextureWorkloadShader(), Utils::getFullscreenQuad(0.8f));
	}